

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unzip.c
# Opt level: O1

unzFile unzOpenInternal(void *path,zlib_filefunc64_32_def *pzlib_filefunc64_32_def,
                       int is64bitOpenFunction)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  voidpf pvVar8;
  ZPOS64_T ZVar9;
  void *pvVar10;
  uLong uVar11;
  long lVar12;
  unz64_s *s;
  ulong uVar13;
  uLong uVar14;
  zlib_filefunc64_32_def *pzVar15;
  ulong uVar16;
  bool bVar17;
  uLong uL;
  uLong number_disk;
  uLong number_disk_with_CD;
  ZPOS64_T number_entry_CD;
  ZPOS64_T uL64;
  uLong uS;
  ZPOS64_T local_1d8;
  ZPOS64_T local_1c8;
  uLong local_1c0;
  long local_1b8;
  ZPOS64_T local_1b0;
  uLong local_1a8;
  int local_19c;
  uLong local_198;
  ZPOS64_T local_190;
  uLong local_188;
  zlib_filefunc64_32_def local_180;
  int local_128;
  voidpf local_120;
  uLong local_118 [6];
  ulong local_e8;
  uLong local_e0;
  uLong local_d8 [19];
  undefined8 local_40;
  undefined4 local_38;
  undefined4 local_34;
  
  local_180.ztell32_file = (tell_file_func)0x0;
  local_180.zseek32_file = (seek_file_func)0x0;
  if (pzlib_filefunc64_32_def == (zlib_filefunc64_32_def *)0x0) {
    fill_fopen64_filefunc(&local_180.zfile_func64);
  }
  else {
    pzVar15 = &local_180;
    for (lVar12 = 0xb; lVar12 != 0; lVar12 = lVar12 + -1) {
      (pzVar15->zfile_func64).zopen64_file = (pzlib_filefunc64_32_def->zfile_func64).zopen64_file;
      pzlib_filefunc64_32_def =
           (zlib_filefunc64_32_def *)&(pzlib_filefunc64_32_def->zfile_func64).zread_file;
      pzVar15 = (zlib_filefunc64_32_def *)&(pzVar15->zfile_func64).zread_file;
    }
  }
  local_128 = is64bitOpenFunction;
  pvVar8 = call_zopen64(&local_180,path,5);
  if (pvVar8 == (voidpf)0x0) {
    return (unzFile)0x0;
  }
  local_120 = pvVar8;
  lVar12 = call_zseek64(&local_180,pvVar8,0,2);
  local_1c8 = 0;
  if (lVar12 != 0) goto LAB_001a8740;
  ZVar9 = call_ztell64(&local_180,pvVar8);
  uVar13 = 0xffff;
  if (ZVar9 < 0xffff) {
    uVar13 = ZVar9;
  }
  pvVar10 = malloc(0x404);
  if (pvVar10 != (void *)0x0) {
    local_1b8 = ZVar9 - 4;
    uVar16 = 4;
    local_1d8 = 0;
    do {
      if (uVar13 <= uVar16) break;
      uVar16 = uVar16 + 0x400;
      if (uVar13 <= uVar16) {
        uVar16 = uVar13;
      }
      uVar14 = 0x404;
      if (uVar16 < 0x404) {
        uVar14 = uVar16;
      }
      lVar12 = call_zseek64(&local_180,pvVar8,ZVar9 - uVar16,0);
      if ((lVar12 == 0) &&
         (uVar11 = (*local_180.zfile_func64.zread_file)
                             (local_180.zfile_func64.opaque,pvVar8,pvVar10,uVar14), uVar11 == uVar14
         )) {
        if (3 < ZVar9) {
          do {
            if ((((*(char *)((long)pvVar10 + (uVar14 - 4)) == 'P') &&
                 (*(char *)((long)pvVar10 + (uVar14 - 3)) == 'K')) &&
                (*(char *)((long)pvVar10 + (uVar14 - 2)) == '\x06')) &&
               (*(char *)((long)pvVar10 + (uVar14 - 1)) == '\a')) {
              local_1d8 = (local_1b8 - uVar16) + uVar14;
              break;
            }
            lVar12 = uVar14 - 4;
            bVar17 = uVar14 != 4;
            uVar14 = uVar14 - 1;
          } while (bVar17 && -1 < lVar12);
        }
        bVar17 = local_1d8 == 0;
      }
      else {
        bVar17 = false;
      }
    } while (bVar17);
    free(pvVar10);
    if (local_1d8 != 0) {
      lVar12 = call_zseek64(&local_180,pvVar8,local_1d8,0);
      local_1c8 = 0;
      if (lVar12 != 0) goto LAB_001a8740;
      iVar1 = unz64local_getLong(&local_180,pvVar8,&local_1c0);
      if (iVar1 == 0) {
        iVar1 = unz64local_getLong(&local_180,pvVar8,&local_1c0);
        local_1c8 = 0;
        if ((iVar1 != 0) || (local_1c8 = 0, local_1c0 != 0)) goto LAB_001a8740;
        iVar1 = unz64local_getLong64(&local_180,pvVar8,&local_1b0);
        if (iVar1 == 0) {
          iVar1 = unz64local_getLong(&local_180,pvVar8,&local_1c0);
          ZVar9 = local_1b0;
          local_1c8 = 0;
          if ((iVar1 == 0) && (local_1c0 == 1)) {
            lVar12 = call_zseek64(&local_180,pvVar8,local_1b0,0);
            local_1c8 = 0;
            if (lVar12 == 0) {
              iVar1 = unz64local_getLong(&local_180,pvVar8,&local_1c0);
              if (local_1c0 != 0x6064b50) {
                ZVar9 = 0;
              }
              local_1c8 = ZVar9;
              if (iVar1 != 0) {
                local_1c8 = 0;
              }
            }
          }
          goto LAB_001a8740;
        }
      }
    }
  }
  local_1c8 = 0;
LAB_001a8740:
  pvVar8 = local_120;
  if (local_1c8 == 0) {
    local_1c8 = 0;
    lVar12 = call_zseek64(&local_180,local_120,0,2);
    if (lVar12 == 0) {
      ZVar9 = call_ztell64(&local_180,pvVar8);
      uVar13 = 0xffff;
      if (ZVar9 < 0xffff) {
        uVar13 = ZVar9;
      }
      pvVar10 = malloc(0x404);
      if (pvVar10 == (void *)0x0) {
        local_1c8 = 0;
      }
      else {
        local_1b8 = ZVar9 - 4;
        uVar16 = 4;
        local_1c8 = 0;
        do {
          if (uVar13 <= uVar16) break;
          uVar16 = uVar16 + 0x400;
          if (uVar13 <= uVar16) {
            uVar16 = uVar13;
          }
          uVar14 = 0x404;
          if (uVar16 < 0x404) {
            uVar14 = uVar16;
          }
          lVar12 = call_zseek64(&local_180,pvVar8,ZVar9 - uVar16,0);
          if ((lVar12 == 0) &&
             (uVar11 = (*local_180.zfile_func64.zread_file)
                                 (local_180.zfile_func64.opaque,pvVar8,pvVar10,uVar14),
             uVar11 == uVar14)) {
            if (3 < ZVar9) {
              do {
                if ((((*(char *)((long)pvVar10 + (uVar14 - 4)) == 'P') &&
                     (*(char *)((long)pvVar10 + (uVar14 - 3)) == 'K')) &&
                    (*(char *)((long)pvVar10 + (uVar14 - 2)) == '\x05')) &&
                   (*(char *)((long)pvVar10 + (uVar14 - 1)) == '\x06')) {
                  local_1c8 = (local_1b8 - uVar16) + uVar14;
                  break;
                }
                lVar12 = uVar14 - 4;
                bVar17 = uVar14 != 4;
                uVar14 = uVar14 - 1;
              } while (bVar17 && -1 < lVar12);
            }
            bVar17 = local_1c8 == 0;
          }
          else {
            bVar17 = false;
          }
        } while (bVar17);
        free(pvVar10);
      }
    }
    local_34 = 0;
    lVar12 = call_zseek64(&local_180,local_120,local_1c8,0);
    iVar2 = unz64local_getLong(&local_180,local_120,&local_1c0);
    iVar3 = unz64local_getShort(&local_180,local_120,&local_1b0);
    iVar4 = unz64local_getShort(&local_180,local_120,&local_1a8);
    iVar5 = unz64local_getShort(&local_180,local_120,&local_1c0);
    local_118[0] = local_1c0;
    iVar6 = unz64local_getShort(&local_180,local_120,&local_1c0);
    local_198 = local_1c0;
    iVar1 = -0x67;
    if ((local_1c0 == local_118[0] && local_1a8 == 0) && local_1b0 == 0) {
      iVar1 = -(uint)((lVar12 != 0 || local_1c8 == 0) ||
                     (((iVar4 != 0 || iVar3 != 0) || (iVar6 != 0 || iVar5 != 0)) || iVar2 != 0));
    }
    iVar3 = unz64local_getLong(&local_180,local_120,&local_1c0);
    local_e0 = local_1c0;
    iVar4 = unz64local_getLong(&local_180,local_120,&local_1c0);
    local_d8[0] = local_1c0;
    iVar5 = unz64local_getShort(&local_180,local_120,local_118 + 1);
    iVar2 = -1;
    if ((iVar5 == 0 && iVar4 == 0) && iVar3 == 0) {
      iVar2 = iVar1;
    }
  }
  else {
    local_34 = 1;
    lVar12 = call_zseek64(&local_180,local_120,local_1c8,0);
    iVar2 = unz64local_getLong(&local_180,local_120,&local_1c0);
    iVar1 = unz64local_getLong64(&local_180,local_120,&local_190);
    local_1b8 = CONCAT44(local_1b8._4_4_,iVar1);
    local_19c = unz64local_getShort(&local_180,local_120,&local_188);
    iVar3 = unz64local_getShort(&local_180,local_120,&local_188);
    iVar4 = unz64local_getLong(&local_180,local_120,&local_1b0);
    iVar5 = unz64local_getLong(&local_180,local_120,&local_1a8);
    iVar6 = unz64local_getLong64(&local_180,local_120,local_118);
    iVar7 = unz64local_getLong64(&local_180,local_120,&local_198);
    iVar1 = -0x67;
    if ((local_198 == local_118[0] && local_1a8 == 0) && local_1b0 == 0) {
      iVar1 = -(uint)(((((iVar3 != 0 || local_19c != 0) || (int)local_1b8 != 0) ||
                       ((iVar5 != 0 || iVar4 != 0) || (iVar7 != 0 || iVar6 != 0))) || iVar2 != 0) ||
                     lVar12 != 0);
    }
    iVar3 = unz64local_getLong64(&local_180,local_120,&local_e0);
    iVar4 = unz64local_getLong64(&local_180,local_120,local_d8);
    iVar2 = -1;
    if (iVar4 == 0 && iVar3 == 0) {
      iVar2 = iVar1;
    }
    local_118[1] = 0;
  }
  local_118[2] = local_1c8 - (local_e0 + local_d8[0]);
  if ((local_e0 + local_d8[0] <= local_1c8) && (iVar2 == 0)) {
    local_e8 = local_1c8;
    local_40 = 0;
    local_38 = 0;
    pvVar10 = malloc(0x150);
    if (pvVar10 != (void *)0x0) {
      memcpy(pvVar10,&local_180,0x150);
      *(undefined8 *)((long)pvVar10 + 0x88) = *(undefined8 *)((long)pvVar10 + 0xa8);
      *(undefined8 *)((long)pvVar10 + 0x80) = 0;
      iVar1 = unz64local_GetCurrentFileInfoInternal
                        (pvVar10,(unz_file_info64 *)((long)pvVar10 + 0xb0),
                         (unz_file_info64_internal *)((long)pvVar10 + 0x138),(char *)0x0,0,
                         (void *)0x0,0,(char *)0x0,0);
      *(ulong *)((long)pvVar10 + 0x90) = (ulong)(iVar1 == 0);
      return pvVar10;
    }
    return (unzFile)0x0;
  }
  (*local_180.zfile_func64.zclose_file)(local_180.zfile_func64.opaque,local_120);
  return (unzFile)0x0;
}

Assistant:

local unzFile unzOpenInternal(const void* path,
    zlib_filefunc64_32_def* pzlib_filefunc64_32_def,
    int is64bitOpenFunction)
{
    unz64_s us;
    unz64_s* s;
    ZPOS64_T central_pos;
    uLong   uL;

    uLong number_disk;          /* number of the current dist, used for
                                   spaning ZIP, unsupported, always 0*/
    uLong number_disk_with_CD;  /* number the the disk with central dir, used
                                   for spaning ZIP, unsupported, always 0*/
    ZPOS64_T number_entry_CD;      /* total number of entries in
                                   the central dir
                                   (same than number_entry on nospan) */

    int err = UNZ_OK;

    if (unz_copyright[0] != ' ')
        return NULL;

    us.z_filefunc.zseek32_file = NULL;
    us.z_filefunc.ztell32_file = NULL;
    if (pzlib_filefunc64_32_def == NULL)
        fill_fopen64_filefunc(&us.z_filefunc.zfile_func64);
    else
        us.z_filefunc = *pzlib_filefunc64_32_def;
    us.is64bitOpenFunction = is64bitOpenFunction;



    us.filestream = ZOPEN64(us.z_filefunc,
        path,
        ZLIB_FILEFUNC_MODE_READ |
        ZLIB_FILEFUNC_MODE_EXISTING);
    if (us.filestream == NULL)
        return NULL;

    central_pos = unz64local_SearchCentralDir64(&us.z_filefunc, us.filestream);
    if (central_pos)
    {
        uLong uS;
        ZPOS64_T uL64;

        us.isZip64 = 1;

        if (ZSEEK64(us.z_filefunc, us.filestream,
            central_pos, ZLIB_FILEFUNC_SEEK_SET) != 0)
            err = UNZ_ERRNO;

        /* the signature, already checked */
        if (unz64local_getLong(&us.z_filefunc, us.filestream, &uL) != UNZ_OK)
            err = UNZ_ERRNO;

        /* size of zip64 end of central directory record */
        if (unz64local_getLong64(&us.z_filefunc, us.filestream, &uL64) != UNZ_OK)
            err = UNZ_ERRNO;

        /* version made by */
        if (unz64local_getShort(&us.z_filefunc, us.filestream, &uS) != UNZ_OK)
            err = UNZ_ERRNO;

        /* version needed to extract */
        if (unz64local_getShort(&us.z_filefunc, us.filestream, &uS) != UNZ_OK)
            err = UNZ_ERRNO;

        /* number of this disk */
        if (unz64local_getLong(&us.z_filefunc, us.filestream, &number_disk) != UNZ_OK)
            err = UNZ_ERRNO;

        /* number of the disk with the start of the central directory */
        if (unz64local_getLong(&us.z_filefunc, us.filestream, &number_disk_with_CD) != UNZ_OK)
            err = UNZ_ERRNO;

        /* total number of entries in the central directory on this disk */
        if (unz64local_getLong64(&us.z_filefunc, us.filestream, &us.gi.number_entry) != UNZ_OK)
            err = UNZ_ERRNO;

        /* total number of entries in the central directory */
        if (unz64local_getLong64(&us.z_filefunc, us.filestream, &number_entry_CD) != UNZ_OK)
            err = UNZ_ERRNO;

        if ((number_entry_CD != us.gi.number_entry) ||
            (number_disk_with_CD != 0) ||
            (number_disk != 0))
            err = UNZ_BADZIPFILE;

        /* size of the central directory */
        if (unz64local_getLong64(&us.z_filefunc, us.filestream, &us.size_central_dir) != UNZ_OK)
            err = UNZ_ERRNO;

        /* offset of start of central directory with respect to the
          starting disk number */
        if (unz64local_getLong64(&us.z_filefunc, us.filestream, &us.offset_central_dir) != UNZ_OK)
            err = UNZ_ERRNO;

        us.gi.size_comment = 0;
    }
    else
    {
        central_pos = unz64local_SearchCentralDir(&us.z_filefunc, us.filestream);
        if (central_pos == 0)
            err = UNZ_ERRNO;

        us.isZip64 = 0;

        if (ZSEEK64(us.z_filefunc, us.filestream,
            central_pos, ZLIB_FILEFUNC_SEEK_SET) != 0)
            err = UNZ_ERRNO;

        /* the signature, already checked */
        if (unz64local_getLong(&us.z_filefunc, us.filestream, &uL) != UNZ_OK)
            err = UNZ_ERRNO;

        /* number of this disk */
        if (unz64local_getShort(&us.z_filefunc, us.filestream, &number_disk) != UNZ_OK)
            err = UNZ_ERRNO;

        /* number of the disk with the start of the central directory */
        if (unz64local_getShort(&us.z_filefunc, us.filestream, &number_disk_with_CD) != UNZ_OK)
            err = UNZ_ERRNO;

        /* total number of entries in the central dir on this disk */
        if (unz64local_getShort(&us.z_filefunc, us.filestream, &uL) != UNZ_OK)
            err = UNZ_ERRNO;
        us.gi.number_entry = uL;

        /* total number of entries in the central dir */
        if (unz64local_getShort(&us.z_filefunc, us.filestream, &uL) != UNZ_OK)
            err = UNZ_ERRNO;
        number_entry_CD = uL;

        if ((number_entry_CD != us.gi.number_entry) ||
            (number_disk_with_CD != 0) ||
            (number_disk != 0))
            err = UNZ_BADZIPFILE;

        /* size of the central directory */
        if (unz64local_getLong(&us.z_filefunc, us.filestream, &uL) != UNZ_OK)
            err = UNZ_ERRNO;
        us.size_central_dir = uL;

        /* offset of start of central directory with respect to the
            starting disk number */
        if (unz64local_getLong(&us.z_filefunc, us.filestream, &uL) != UNZ_OK)
            err = UNZ_ERRNO;
        us.offset_central_dir = uL;

        /* zipfile comment length */
        if (unz64local_getShort(&us.z_filefunc, us.filestream, &us.gi.size_comment) != UNZ_OK)
            err = UNZ_ERRNO;
    }

    if ((central_pos < us.offset_central_dir + us.size_central_dir) &&
        (err == UNZ_OK))
        err = UNZ_BADZIPFILE;

    if (err != UNZ_OK)
    {
        ZCLOSE64(us.z_filefunc, us.filestream);
        return NULL;
    }

    us.byte_before_the_zipfile = central_pos -
        (us.offset_central_dir + us.size_central_dir);
    us.central_pos = central_pos;
    us.pfile_in_zip_read = NULL;
    us.encrypted = 0;


    s = (unz64_s*)ALLOC(sizeof(unz64_s));
    if (s != NULL)
    {
        *s = us;
        unzGoToFirstFile((unzFile)s);
    }
    return (unzFile)s;
}